

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int encode_client_hello(ptls_context_t *ctx,ptls_buffer_t *sendbuf,encode_ch_mode mode,
                       int is_second_flight,ptls_handshake_properties_t *properties,
                       void *client_random,ptls_key_exchange_context_t *key_share_ctx,char *sni_name
                       ,ptls_iovec_t legacy_session_id,st_ptls_ech_t *ech,size_t *ech_size_offset,
                       ptls_iovec_t ech_replay,ptls_iovec_t psk_secret,ptls_iovec_t psk_identity,
                       uint32_t obfuscated_ticket_age,size_t psk_binder_size,ptls_iovec_t *cookie,
                       int using_early_data)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  ushort uVar4;
  size_t sVar5;
  ptls_cipher_suite_t *ppVar6;
  ptls_iovec_t *ppVar7;
  ptls_key_exchange_algorithm_t *ppVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  uint16_t uVar20;
  ptls_key_exchange_algorithm_t **pppVar21;
  uint8_t *puVar22;
  size_t sVar23;
  ptls_cipher_suite_t **pppVar24;
  size_t sVar25;
  uint16_t *puVar26;
  undefined4 in_stack_0000006c;
  uint local_4c;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  if (ech == (st_ptls_ech_t *)0x0 && mode != ENCODE_CH_MODE_INNER) {
    __assert_fail("mode == ENCODE_CH_MODE_INNER || ech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x86d,
                  "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                 );
  }
  iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar13 != 0) {
    return iVar13;
  }
  sendbuf->base[sendbuf->off] = '\x01';
  sendbuf->off = sendbuf->off + 1;
  iVar13 = ptls_buffer_reserve_aligned(sendbuf,3,'\0');
  if (iVar13 != 0) {
    return iVar13;
  }
  puVar22 = sendbuf->base;
  sVar5 = sendbuf->off;
  puVar22[sVar5 + 2] = '\0';
  puVar22 = puVar22 + sVar5;
  puVar22[0] = '\0';
  puVar22[1] = '\0';
  sVar15 = sendbuf->off;
  sVar5 = sVar15 + 3;
  sendbuf->off = sVar5;
  iVar13 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar13 != 0) {
    return iVar13;
  }
  puVar22 = sendbuf->base;
  sVar18 = sendbuf->off;
  (puVar22 + sVar18)[0] = '\x03';
  (puVar22 + sVar18)[1] = '\x03';
  sendbuf->off = sendbuf->off + 2;
  local_38 = sVar5;
  iVar13 = ptls_buffer_reserve_aligned(sendbuf,0x20,'\0');
  if (iVar13 != 0) {
    return iVar13;
  }
  puVar22 = sendbuf->base;
  sVar5 = sendbuf->off;
  uVar9 = *client_random;
  uVar10 = *(undefined8 *)((long)client_random + 8);
  uVar11 = *(undefined8 *)((long)client_random + 0x18);
  puVar1 = puVar22 + sVar5 + 0x10;
  *(undefined8 *)puVar1 = *(undefined8 *)((long)client_random + 0x10);
  *(undefined8 *)(puVar1 + 8) = uVar11;
  puVar22 = puVar22 + sVar5;
  *(undefined8 *)puVar22 = uVar9;
  *(undefined8 *)(puVar22 + 8) = uVar10;
  sendbuf->off = sendbuf->off + 0x20;
  iVar13 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar13 != 0) {
    return iVar13;
  }
  sendbuf->base[sendbuf->off] = '\0';
  sVar5 = sendbuf->off;
  sVar23 = sVar5 + 1;
  sendbuf->off = sVar23;
  sVar18 = sVar23;
  if (mode != ENCODE_CH_MODE_ENCODED_INNER) {
    iVar13 = ptls_buffer__do_pushv(sendbuf,legacy_session_id.base,legacy_session_id.len);
    if (iVar13 != 0) {
      return iVar13;
    }
    sVar18 = sendbuf->off;
  }
  iVar13 = 0x20c;
  if (0xff < sVar18 - sVar23) {
    return 0x20c;
  }
  sendbuf->base[sVar5] = (uint8_t)(sVar18 - sVar23);
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  puVar22 = sendbuf->base;
  sVar5 = sendbuf->off;
  (puVar22 + sVar5)[0] = '\0';
  (puVar22 + sVar5)[1] = '\0';
  sVar18 = sendbuf->off;
  sVar5 = sVar18 + 2;
  sendbuf->off = sVar5;
  pppVar24 = ctx->cipher_suites;
  ppVar6 = *pppVar24;
  local_48 = sVar15;
  sVar15 = sVar5;
  while (ppVar6 != (ptls_cipher_suite_t *)0x0) {
    pppVar24 = pppVar24 + 1;
    uVar4 = ppVar6->id;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
    sVar15 = sendbuf->off + 2;
    sendbuf->off = sVar15;
    ppVar6 = *pppVar24;
  }
  uVar16 = sVar15 - sVar5;
  if (0xffff < uVar16) {
    return 0x20c;
  }
  sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
  sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  sendbuf->base[sendbuf->off] = '\0';
  sVar5 = sendbuf->off;
  sendbuf->off = sVar5 + 1;
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  sendbuf->base[sendbuf->off] = '\0';
  sVar15 = sendbuf->off;
  sendbuf->off = sVar15 + 1;
  uVar16 = sVar15 - sVar5;
  if (0xff < uVar16) {
    return 0x20c;
  }
  sendbuf->base[sVar5] = (uint8_t)uVar16;
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  puVar22 = sendbuf->base;
  sVar5 = sendbuf->off;
  (puVar22 + sVar5)[0] = '\0';
  (puVar22 + sVar5)[1] = '\0';
  sVar5 = sendbuf->off;
  sendbuf->off = sVar5 + 2;
  if (mode == ENCODE_CH_MODE_OUTER) {
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = 0xfe;
    (puVar22 + sVar15)[1] = '\r';
    sendbuf->off = sendbuf->off + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\0';
    sVar15 = sendbuf->off;
    sendbuf->off = sVar15 + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    sendbuf->base[sendbuf->off] = '\0';
    sendbuf->off = sendbuf->off + 1;
    uVar4 = (ech->cipher->id).kdf;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
    sendbuf->off = sendbuf->off + 2;
    uVar4 = (ech->cipher->id).aead;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
    sendbuf->off = sendbuf->off + 2;
    uVar2 = ech->config_id;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    sendbuf->base[sendbuf->off] = uVar2;
    sendbuf->off = sendbuf->off + 1;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar22 + sVar18)[0] = '\0';
    (puVar22 + sVar18)[1] = '\0';
    sVar18 = sendbuf->off;
    sVar17 = sVar18 + 2;
    sendbuf->off = sVar17;
    sVar23 = sVar17;
    if (is_second_flight == 0) {
      iVar14 = ptls_buffer__do_pushv(sendbuf,(ech->client).enc.base,(ech->client).enc.len);
      if (iVar14 != 0) {
        return iVar14;
      }
      sVar23 = sendbuf->off;
    }
    uVar16 = sVar23 - sVar17;
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar22 + sVar18)[0] = '\0';
    (puVar22 + sVar18)[1] = '\0';
    sVar18 = sendbuf->off;
    sendbuf->off = sVar18 + 2;
    lVar19 = 10;
    if (is_second_flight == 0) {
      lVar19 = (ech->client).enc.len + 10;
    }
    if (sVar18 - sVar15 != lVar19) {
      __assert_fail("sendbuf->off - ext_payload_from == outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x890,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,*ech_size_offset,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    memset(sendbuf->base + sendbuf->off,0,*ech_size_offset);
    sVar23 = sendbuf->off + *ech_size_offset;
    sendbuf->off = sVar23;
    *ech_size_offset = sVar23 - *ech_size_offset;
    uVar16 = sendbuf->off - (sVar18 + 2);
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
    uVar16 = sendbuf->off - (sVar15 + 2);
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
  }
  else {
    if (ech->aead == (ptls_aead_context_t *)0x0) {
      if (ech_replay.base != (uint8_t *)0x0) {
        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar14 != 0) {
          return iVar14;
        }
        puVar22 = sendbuf->base;
        sVar15 = sendbuf->off;
        (puVar22 + sVar15)[0] = 0xfe;
        (puVar22 + sVar15)[1] = '\r';
        sendbuf->off = sendbuf->off + 2;
        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar14 != 0) {
          return iVar14;
        }
        puVar22 = sendbuf->base;
        sVar15 = sendbuf->off;
        (puVar22 + sVar15)[0] = '\0';
        (puVar22 + sVar15)[1] = '\0';
        sVar15 = sendbuf->off;
        sendbuf->off = sVar15 + 2;
        iVar14 = ptls_buffer__do_pushv(sendbuf,ech_replay.base,ech_replay.len);
        if (iVar14 != 0) {
          return iVar14;
        }
        uVar16 = sendbuf->off - (sVar15 + 2);
        goto LAB_00123e8e;
      }
    }
    else {
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      puVar22 = sendbuf->base;
      sVar15 = sendbuf->off;
      (puVar22 + sVar15)[0] = 0xfe;
      (puVar22 + sVar15)[1] = '\r';
      sendbuf->off = sendbuf->off + 2;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      puVar22 = sendbuf->base;
      sVar15 = sendbuf->off;
      (puVar22 + sVar15)[0] = '\0';
      (puVar22 + sVar15)[1] = '\0';
      sVar15 = sendbuf->off;
      sendbuf->off = sVar15 + 2;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      sendbuf->base[sendbuf->off] = '\x01';
      sVar18 = sendbuf->off + 1;
      sendbuf->off = sVar18;
      uVar16 = sVar18 - (sVar15 + 2);
LAB_00123e8e:
      if (0xffff < uVar16) {
        return 0x20c;
      }
      sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
      sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
    }
    if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      puVar22 = sendbuf->base;
      sVar15 = sendbuf->off;
      (puVar22 + sVar15)[0] = 0xfd;
      (puVar22 + sVar15)[1] = '\0';
      sendbuf->off = sendbuf->off + 2;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      puVar22 = sendbuf->base;
      sVar15 = sendbuf->off;
      (puVar22 + sVar15)[0] = '\0';
      (puVar22 + sVar15)[1] = '\0';
      sVar18 = sendbuf->off;
      sVar15 = sVar18 + 2;
      sendbuf->off = sVar15;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      sendbuf->base[sendbuf->off] = '\0';
      sVar23 = sendbuf->off;
      sVar17 = sVar23 + 1;
      sendbuf->off = sVar17;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      puVar22 = sendbuf->base;
      sVar25 = sendbuf->off;
      (puVar22 + sVar25)[0] = '\0';
      (puVar22 + sVar25)[1] = '3';
      sVar25 = sendbuf->off + 2;
      sendbuf->off = sVar25;
      uVar16 = sVar25 - sVar17;
      if (0xff < uVar16) {
        return 0x20c;
      }
      sendbuf->base[sVar23] = (uint8_t)uVar16;
      goto LAB_0012408e;
    }
  }
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  puVar22 = sendbuf->base;
  sVar15 = sendbuf->off;
  (puVar22 + sVar15)[0] = '\0';
  (puVar22 + sVar15)[1] = '3';
  sendbuf->off = sendbuf->off + 2;
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  puVar22 = sendbuf->base;
  sVar15 = sendbuf->off;
  (puVar22 + sVar15)[0] = '\0';
  (puVar22 + sVar15)[1] = '\0';
  sVar18 = sendbuf->off;
  sVar15 = sVar18 + 2;
  sendbuf->off = sVar15;
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 != 0) {
    return iVar14;
  }
  puVar22 = sendbuf->base;
  sVar23 = sendbuf->off;
  (puVar22 + sVar23)[0] = '\0';
  (puVar22 + sVar23)[1] = '\0';
  sVar17 = sendbuf->off;
  sVar23 = sVar17 + 2;
  sendbuf->off = sVar23;
  sVar25 = sVar23;
  if (key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    iVar14 = push_key_share_entry(sendbuf,key_share_ctx->algo->id,key_share_ctx->pubkey);
    if (iVar14 != 0) {
      return iVar14;
    }
    sVar25 = sendbuf->off;
  }
  uVar16 = sVar25 - sVar23;
  if (0xffff < uVar16) {
    return 0x20c;
  }
  sendbuf->base[sVar17] = (uint8_t)(uVar16 >> 8);
  sendbuf->base[sVar17 + 1] = (uint8_t)uVar16;
LAB_0012408e:
  uVar16 = sendbuf->off - sVar15;
  if (0xffff < uVar16) {
    return 0x20c;
  }
  sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
  sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
  if (sni_name != (char *)0x0) {
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\0';
    sendbuf->off = sendbuf->off + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\0';
    sVar15 = sendbuf->off;
    sendbuf->off = sVar15 + 2;
    iVar14 = emit_server_name_extension(sendbuf,sni_name);
    if (iVar14 != 0) {
      return iVar14;
    }
    uVar16 = sendbuf->off - (sVar15 + 2);
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
  }
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     ((properties->field_0).client.negotiated_protocols.count != 0)) {
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\x10';
    sendbuf->off = sendbuf->off + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\0';
    sVar15 = sendbuf->off;
    sendbuf->off = sVar15 + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar18 = sendbuf->off;
    (puVar22 + sVar18)[0] = '\0';
    (puVar22 + sVar18)[1] = '\0';
    local_40 = sendbuf->off;
    sVar18 = local_40 + 2;
    sendbuf->off = sVar18;
    sVar23 = sVar18;
    if ((properties->field_0).client.negotiated_protocols.count != 0) {
      lVar19 = 8;
      sVar23 = 0;
      do {
        iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
        if (iVar14 != 0) {
          return iVar14;
        }
        sendbuf->base[sendbuf->off] = '\0';
        sVar17 = sendbuf->off;
        sVar25 = sVar17 + 1;
        sendbuf->off = sVar25;
        ppVar7 = (properties->field_0).client.negotiated_protocols.list;
        iVar14 = ptls_buffer__do_pushv
                           (sendbuf,*(void **)((long)ppVar7 + lVar19 + -8),
                            *(size_t *)((long)&ppVar7->base + lVar19));
        if (iVar14 != 0) {
          return iVar14;
        }
        uVar16 = sendbuf->off - sVar25;
        if (0xff < uVar16) {
          return 0x20c;
        }
        sendbuf->base[sVar17] = (uint8_t)uVar16;
        sVar23 = sVar23 + 1;
        lVar19 = lVar19 + 0x10;
      } while (sVar23 != (properties->field_0).client.negotiated_protocols.count);
      sVar23 = sendbuf->off;
    }
    uVar16 = sVar23 - sVar18;
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[local_40] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[local_40 + 1] = (uint8_t)uVar16;
    uVar16 = sendbuf->off - (sVar15 + 2);
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
  }
  if (ctx->decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\x1b';
    sendbuf->off = sendbuf->off + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '\0';
    sVar15 = sendbuf->off;
    sendbuf->off = sVar15 + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
    if (iVar14 != 0) {
      return iVar14;
    }
    sendbuf->base[sendbuf->off] = '\0';
    sVar18 = sendbuf->off;
    sVar23 = sVar18 + 1;
    sendbuf->off = sVar23;
    puVar26 = ctx->decompress_certificate->supported_algorithms;
    uVar20 = *puVar26;
    if (uVar20 == 0xffff) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x8c3,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    do {
      puVar26 = puVar26 + 1;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar14 != 0) {
        return iVar14;
      }
      *(uint16_t *)(sendbuf->base + sendbuf->off) = uVar20 << 8 | uVar20 >> 8;
      sVar17 = sendbuf->off + 2;
      sendbuf->off = sVar17;
      uVar20 = *puVar26;
    } while (uVar20 != 0xffff);
    uVar16 = sVar17 - sVar23;
    if (0xff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar18] = (uint8_t)uVar16;
    uVar16 = sendbuf->off - (sVar15 + 2);
    if (0xffff < uVar16) {
      return 0x20c;
    }
    sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
    sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
  }
  iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
  if (iVar14 == 0) {
    puVar22 = sendbuf->base;
    sVar15 = sendbuf->off;
    (puVar22 + sVar15)[0] = '\0';
    (puVar22 + sVar15)[1] = '+';
    sendbuf->off = sendbuf->off + 2;
    iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
    if (iVar14 == 0) {
      puVar22 = sendbuf->base;
      sVar15 = sendbuf->off;
      (puVar22 + sVar15)[0] = '\0';
      (puVar22 + sVar15)[1] = '\0';
      sVar15 = sendbuf->off;
      sendbuf->off = sVar15 + 2;
      iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
      if (iVar14 == 0) {
        sendbuf->base[sendbuf->off] = '\0';
        sVar18 = sendbuf->off;
        sVar23 = sVar18 + 1;
        sendbuf->off = sVar23;
        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
        if (iVar14 == 0) {
          puVar22 = sendbuf->base;
          sVar17 = sendbuf->off;
          (puVar22 + sVar17)[0] = '\x03';
          (puVar22 + sVar17)[1] = '\x04';
          sVar17 = sendbuf->off + 2;
          sendbuf->off = sVar17;
          uVar16 = sVar17 - sVar23;
          iVar14 = iVar13;
          if (uVar16 < 0x100) {
            sendbuf->base[sVar18] = (uint8_t)uVar16;
            uVar16 = sendbuf->off - (sVar15 + 2);
            if (uVar16 < 0x10000) {
              sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
              sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
              iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
              if (iVar14 == 0) {
                puVar22 = sendbuf->base;
                sVar15 = sendbuf->off;
                (puVar22 + sVar15)[0] = '\0';
                (puVar22 + sVar15)[1] = '\r';
                sendbuf->off = sendbuf->off + 2;
                iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                if (iVar14 == 0) {
                  puVar22 = sendbuf->base;
                  sVar15 = sendbuf->off;
                  (puVar22 + sVar15)[0] = '\0';
                  (puVar22 + sVar15)[1] = '\0';
                  sVar15 = sendbuf->off;
                  sendbuf->off = sVar15 + 2;
                  iVar14 = push_signature_algorithms(ctx->verify_certificate,sendbuf);
                  if ((iVar14 == 0) &&
                     (uVar16 = sendbuf->off - (sVar15 + 2), iVar14 = iVar13, uVar16 < 0x10000)) {
                    sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                    sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                    if (ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0) {
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\n';
                      sendbuf->off = sendbuf->off + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\0';
                      sVar15 = sendbuf->off;
                      sendbuf->off = sVar15 + 2;
                      pppVar21 = ctx->key_exchanges;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar18 = sendbuf->off;
                      (puVar22 + sVar18)[0] = '\0';
                      (puVar22 + sVar18)[1] = '\0';
                      sVar18 = sendbuf->off;
                      sVar17 = sVar18 + 2;
                      sendbuf->off = sVar17;
                      ppVar8 = *pppVar21;
                      sVar23 = sVar17;
                      while (ppVar8 != (ptls_key_exchange_algorithm_t *)0x0) {
                        pppVar21 = pppVar21 + 1;
                        uVar4 = ppVar8->id;
                        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                        if (iVar14 != 0) {
                          return iVar14;
                        }
                        *(ushort *)(sendbuf->base + sendbuf->off) = uVar4 << 8 | uVar4 >> 8;
                        sVar23 = sendbuf->off + 2;
                        sendbuf->off = sVar23;
                        ppVar8 = *pppVar21;
                      }
                      uVar16 = sVar23 - sVar17;
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
                      uVar16 = sendbuf->off - (sVar15 + 2);
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                    }
                    if ((psk_binder_size != 0) && (*(long *)psk_binder_size != 0)) {
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = ',';
                      sendbuf->off = sendbuf->off + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\0';
                      sVar15 = sendbuf->off;
                      sendbuf->off = sVar15 + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar18 = sendbuf->off;
                      (puVar22 + sVar18)[0] = '\0';
                      (puVar22 + sVar18)[1] = '\0';
                      sVar18 = sendbuf->off;
                      sendbuf->off = sVar18 + 2;
                      iVar14 = ptls_buffer__do_pushv
                                         (sendbuf,*(void **)psk_binder_size,
                                          *(size_t *)(psk_binder_size + 8));
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      uVar16 = sendbuf->off - (sVar18 + 2);
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
                      uVar16 = sendbuf->off - (sVar15 + 2);
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                    }
                    if ((ctx->field_0xb8 & 0x20) != 0) {
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\x14';
                      sendbuf->off = sendbuf->off + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\0';
                      sVar15 = sendbuf->off;
                      sendbuf->off = sVar15 + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      sendbuf->base[sendbuf->off] = '\0';
                      sVar18 = sendbuf->off;
                      sendbuf->off = sVar18 + 1;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      sendbuf->base[sendbuf->off] = '\x02';
                      sVar23 = sendbuf->off;
                      sendbuf->off = sVar23 + 1;
                      uVar16 = sVar23 - sVar18;
                      if (0xff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar18] = (uint8_t)uVar16;
                      uVar16 = sendbuf->off - (sVar15 + 2);
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                    }
                    if ((ctx->save_ticket != (ptls_save_ticket_t *)0x0) &&
                       (((ctx->ticket_requests).client.new_session_count != '\0' ||
                        ((ctx->ticket_requests).client.resumption_count != '\0')))) {
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = ':';
                      sendbuf->off = sendbuf->off + 2;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar15 = sendbuf->off;
                      (puVar22 + sVar15)[0] = '\0';
                      (puVar22 + sVar15)[1] = '\0';
                      sVar15 = sendbuf->off;
                      sendbuf->off = sVar15 + 2;
                      uVar2 = (ctx->ticket_requests).client.new_session_count;
                      uVar3 = (ctx->ticket_requests).client.resumption_count;
                      iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                      if (iVar14 != 0) {
                        return iVar14;
                      }
                      puVar22 = sendbuf->base;
                      sVar18 = sendbuf->off;
                      puVar22[sVar18] = uVar2;
                      puVar22[sVar18 + 1] = uVar3;
                      sVar18 = sendbuf->off;
                      sendbuf->off = sVar18 + 2;
                      uVar16 = sVar18 - sVar15;
                      if (0xffff < uVar16) {
                        return 0x20c;
                      }
                      sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                      sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                    }
                    iVar14 = push_additional_extensions(properties,sendbuf);
                    if (iVar14 == 0) {
                      if (ctx->save_ticket != (ptls_save_ticket_t *)0x0 ||
                          psk_secret.base != (uint8_t *)0x0) {
                        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                        if (iVar14 != 0) {
                          return iVar14;
                        }
                        puVar22 = sendbuf->base;
                        sVar15 = sendbuf->off;
                        (puVar22 + sVar15)[0] = '\0';
                        (puVar22 + sVar15)[1] = '-';
                        sendbuf->off = sendbuf->off + 2;
                        iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                        if (iVar14 != 0) {
                          return iVar14;
                        }
                        puVar22 = sendbuf->base;
                        sVar15 = sendbuf->off;
                        (puVar22 + sVar15)[0] = '\0';
                        (puVar22 + sVar15)[1] = '\0';
                        sVar15 = sendbuf->off;
                        sendbuf->off = sVar15 + 2;
                        iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                        if (iVar14 != 0) {
                          return iVar14;
                        }
                        sendbuf->base[sendbuf->off] = '\0';
                        sVar18 = sendbuf->off;
                        sendbuf->off = sVar18 + 1;
                        if ((ctx->field_0xb8 & 1) == 0) {
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          sendbuf->base[sendbuf->off] = '\0';
                          sendbuf->off = sendbuf->off + 1;
                        }
                        iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                        if (iVar14 != 0) {
                          return iVar14;
                        }
                        sendbuf->base[sendbuf->off] = '\x01';
                        sVar23 = sendbuf->off;
                        sendbuf->off = sVar23 + 1;
                        uVar16 = sVar23 - sVar18;
                        if (0xff < uVar16) {
                          return 0x20c;
                        }
                        sendbuf->base[sVar18] = (uint8_t)uVar16;
                        uVar16 = sendbuf->off - (sVar15 + 2);
                        if (0xffff < uVar16) {
                          return 0x20c;
                        }
                        sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                        sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                        if (psk_secret.base != (uint8_t *)0x0) {
                          if (is_second_flight == 0 && (int)cookie != 0) {
                            iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                            if (iVar14 != 0) {
                              return iVar14;
                            }
                            puVar22 = sendbuf->base;
                            sVar15 = sendbuf->off;
                            (puVar22 + sVar15)[0] = '\0';
                            (puVar22 + sVar15)[1] = '*';
                            sendbuf->off = sendbuf->off + 2;
                            iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                            if (iVar14 != 0) {
                              return iVar14;
                            }
                            puVar22 = sendbuf->base;
                            sVar15 = sendbuf->off;
                            (puVar22 + sVar15)[0] = '\0';
                            (puVar22 + sVar15)[1] = '\0';
                            sVar15 = sendbuf->off;
                            sendbuf->off = sVar15 + 2;
                            sendbuf->base[sVar15] = '\0';
                            sendbuf->base[sVar15 + 1] = '\0';
                          }
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          puVar22 = sendbuf->base;
                          sVar15 = sendbuf->off;
                          (puVar22 + sVar15)[0] = '\0';
                          (puVar22 + sVar15)[1] = ')';
                          sendbuf->off = sendbuf->off + 2;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          puVar22 = sendbuf->base;
                          sVar15 = sendbuf->off;
                          (puVar22 + sVar15)[0] = '\0';
                          (puVar22 + sVar15)[1] = '\0';
                          sVar15 = sendbuf->off;
                          sendbuf->off = sVar15 + 2;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          puVar22 = sendbuf->base;
                          sVar18 = sendbuf->off;
                          (puVar22 + sVar18)[0] = '\0';
                          (puVar22 + sVar18)[1] = '\0';
                          sVar18 = sendbuf->off;
                          sendbuf->off = sVar18 + 2;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          puVar22 = sendbuf->base;
                          sVar23 = sendbuf->off;
                          (puVar22 + sVar23)[0] = '\0';
                          (puVar22 + sVar23)[1] = '\0';
                          sVar23 = sendbuf->off;
                          sendbuf->off = sVar23 + 2;
                          if (mode == ENCODE_CH_MODE_OUTER) {
                            iVar14 = ptls_buffer_reserve_aligned
                                               (sendbuf,(size_t)psk_identity.base,'\0');
                            if (iVar14 != 0) {
                              return iVar14;
                            }
                            (*ctx->random_bytes)
                                      (sendbuf->base + sendbuf->off,(size_t)psk_identity.base);
                            puVar22 = psk_identity.base + sendbuf->off;
                            sendbuf->off = (size_t)puVar22;
                          }
                          else {
                            iVar14 = ptls_buffer__do_pushv
                                               (sendbuf,(void *)psk_secret.len,
                                                (size_t)psk_identity.base);
                            if (iVar14 != 0) {
                              return iVar14;
                            }
                            puVar22 = (uint8_t *)sendbuf->off;
                          }
                          uVar16 = (long)puVar22 - (sVar23 + 2);
                          if (0xffff < uVar16) {
                            return 0x20c;
                          }
                          sendbuf->base[sVar23] = (uint8_t)(uVar16 >> 8);
                          sendbuf->base[sVar23 + 1] = (uint8_t)uVar16;
                          if (mode == ENCODE_CH_MODE_OUTER) {
                            (*ctx->random_bytes)(&local_4c,4);
                          }
                          else {
                            local_4c = (uint)psk_identity.len;
                          }
                          uVar12 = local_4c;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,4,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          *(uint *)(sendbuf->base + sendbuf->off) =
                               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                               uVar12 << 0x18;
                          sVar23 = sendbuf->off + 4;
                          sendbuf->off = sVar23;
                          uVar16 = sVar23 - (sVar18 + 2);
                          if (0xffff < uVar16) {
                            return 0x20c;
                          }
                          sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
                          sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          puVar22 = sendbuf->base;
                          sVar18 = sendbuf->off;
                          (puVar22 + sVar18)[0] = '\0';
                          (puVar22 + sVar18)[1] = '\0';
                          sVar18 = sendbuf->off;
                          sendbuf->off = sVar18 + 2;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,1,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          sVar17 = CONCAT44(in_stack_0000006c,obfuscated_ticket_age);
                          sendbuf->base[sendbuf->off] = '\0';
                          sVar23 = sendbuf->off;
                          sVar25 = sVar23 + 1;
                          sendbuf->off = sVar25;
                          iVar14 = ptls_buffer_reserve_aligned(sendbuf,sVar17,'\0');
                          if (iVar14 != 0) {
                            return iVar14;
                          }
                          (*ctx->random_bytes)(sendbuf->base + sendbuf->off,sVar17);
                          sVar17 = sVar17 + sendbuf->off;
                          sendbuf->off = sVar17;
                          uVar16 = sVar17 - sVar25;
                          if (0xff < uVar16) {
                            return 0x20c;
                          }
                          sendbuf->base[sVar23] = (uint8_t)uVar16;
                          uVar16 = sendbuf->off - (sVar18 + 2);
                          if (0xffff < uVar16) {
                            return 0x20c;
                          }
                          sendbuf->base[sVar18] = (uint8_t)(uVar16 >> 8);
                          sendbuf->base[sVar18 + 1] = (uint8_t)uVar16;
                          uVar16 = sendbuf->off - (sVar15 + 2);
                          if (0xffff < uVar16) {
                            return 0x20c;
                          }
                          sendbuf->base[sVar15] = (uint8_t)(uVar16 >> 8);
                          sendbuf->base[sVar15 + 1] = (uint8_t)uVar16;
                        }
                      }
                      uVar16 = sendbuf->off - (sVar5 + 2);
                      iVar14 = iVar13;
                      if (uVar16 < 0x10000) {
                        sendbuf->base[sVar5] = (uint8_t)(uVar16 >> 8);
                        sendbuf->base[sVar5 + 1] = (uint8_t)uVar16;
                        uVar16 = sendbuf->off - local_38;
                        if (uVar16 < 0x1000000) {
                          lVar19 = 0x10;
                          iVar14 = 0;
                          do {
                            sendbuf->base[local_48] = (uint8_t)(uVar16 >> ((byte)lVar19 & 0x3f));
                            lVar19 = lVar19 + -8;
                            local_48 = local_48 + 1;
                          } while (lVar19 != -8);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar14;
}

Assistant:

static int encode_client_hello(ptls_context_t *ctx, ptls_buffer_t *sendbuf, enum encode_ch_mode mode, int is_second_flight,
                               ptls_handshake_properties_t *properties, const void *client_random,
                               ptls_key_exchange_context_t *key_share_ctx, const char *sni_name, ptls_iovec_t legacy_session_id,
                               struct st_ptls_ech_t *ech, size_t *ech_size_offset, ptls_iovec_t ech_replay, ptls_iovec_t psk_secret,
                               ptls_iovec_t psk_identity, uint32_t obfuscated_ticket_age, size_t psk_binder_size,
                               ptls_iovec_t *cookie, int using_early_data)
{
    int ret;

    assert(mode == ENCODE_CH_MODE_INNER || ech != NULL);

    ptls_buffer_push_message_body(sendbuf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, client_random, PTLS_HELLO_RANDOM_SIZE);
        /* lecagy_session_id */
        ptls_buffer_push_block(sendbuf, 1, {
            if (mode != ENCODE_CH_MODE_ENCODED_INNER)
                ptls_buffer_pushv(sendbuf, legacy_session_id.base, legacy_session_id.len);
        });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            if (mode == ENCODE_CH_MODE_OUTER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO, {
                    size_t ext_payload_from = sendbuf->off;
                    ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_OUTER);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.kdf);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.aead);
                    ptls_buffer_push(sendbuf, ech->config_id);
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (!is_second_flight)
                            ptls_buffer_pushv(sendbuf, ech->client.enc.base, ech->client.enc.len);
                    });
                    ptls_buffer_push_block(sendbuf, 2, {
                        assert(sendbuf->off - ext_payload_from ==
                               outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len));
                        if ((ret = ptls_buffer_reserve(sendbuf, *ech_size_offset)) != 0)
                            goto Exit;
                        memset(sendbuf->base + sendbuf->off, 0, *ech_size_offset);
                        sendbuf->off += *ech_size_offset;
                        *ech_size_offset = sendbuf->off - *ech_size_offset;
                    });
                });
            } else if (ech->aead != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_INNER); });
            } else if (ech_replay.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_pushv(sendbuf, ech_replay.base, ech_replay.len); });
            }
            if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push16(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE); });
                });
            } else {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (key_share_ctx != NULL &&
                            (ret = push_key_share_entry(sendbuf, key_share_ctx->algo->id, key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    });
                });
            }
            if (sni_name != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                    if ((ret = emit_server_name_extension(sendbuf, sni_name)) != 0)
                        goto Exit;
                });
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            if (ctx->key_exchanges != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                    ptls_key_exchange_algorithm_t **algo = ctx->key_exchanges;
                    ptls_buffer_push_block(sendbuf, 2, {
                        for (; *algo != NULL; ++algo)
                            ptls_buffer_push16(sendbuf, (*algo)->id);
                    });
                });
            }
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if (ctx->save_ticket != NULL &&
                (ctx->ticket_requests.client.new_session_count != 0 || ctx->ticket_requests.client.resumption_count != 0)) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_TICKET_REQUEST, {
                    ptls_buffer_push(sendbuf, ctx->ticket_requests.client.new_session_count,
                                     ctx->ticket_requests.client.resumption_count);
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (ctx->save_ticket != NULL || psk_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (psk_secret.base != NULL) {
                if (using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2, {
                            if (mode == ENCODE_CH_MODE_OUTER) {
                                if ((ret = ptls_buffer_reserve(sendbuf, psk_identity.len)) != 0)
                                    goto Exit;
                                ctx->random_bytes(sendbuf->base + sendbuf->off, psk_identity.len);
                                sendbuf->off += psk_identity.len;
                            } else {
                                ptls_buffer_pushv(sendbuf, psk_identity.base, psk_identity.len);
                            }
                        });
                        uint32_t age;
                        if (mode == ENCODE_CH_MODE_OUTER) {
                            ctx->random_bytes(&age, sizeof(age));
                        } else {
                            age = obfuscated_ticket_age;
                        }
                        ptls_buffer_push32(sendbuf, age);
                    });
                    /* allocate space for PSK binder. The space is filled initially filled by a random value (meeting the
                     * requirement of ClientHelloOuter), and later gets filled with the correct binder value if necessary. */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, psk_binder_size)) != 0)
                                goto Exit;
                            ctx->random_bytes(sendbuf->base + sendbuf->off, psk_binder_size);
                            sendbuf->off += psk_binder_size;
                        });
                    });
                });
            }
        });
    });

Exit:
    return ret;
}